

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_throwobject(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  SQTable *pSVar5;
  SQObjectPtr *pSVar6;
  
  pSVar6 = SQVM::GetUp(v,-1);
  SVar2 = (v->_lasterror).super_SQObject._type;
  pSVar4 = (v->_lasterror).super_SQObject._unVal.pTable;
  pSVar5 = (pSVar6->super_SQObject)._unVal.pTable;
  (v->_lasterror).super_SQObject._unVal.pTable = pSVar5;
  SVar3 = (pSVar6->super_SQObject)._type;
  (v->_lasterror).super_SQObject._type = SVar3;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  SQVM::Pop(v);
  return -1;
}

Assistant:

SQRESULT sq_throwobject(HSQUIRRELVM v)
{
    v->_lasterror = v->GetUp(-1);
    v->Pop();
    return SQ_ERROR;
}